

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::CopyQueryPoolResults
          (VulkanCommandBuffer *this,VkQueryPool queryPool,uint32_t firstQuery,uint32_t queryCount,
          VkBuffer dstBuffer,VkDeviceSize dstOffset,VkDeviceSize stride,VkQueryResultFlags flags)

{
  Char *Message;
  undefined4 in_register_0000000c;
  undefined1 local_50 [8];
  string msg;
  VkDeviceSize dstOffset_local;
  VkBuffer dstBuffer_local;
  uint32_t queryCount_local;
  uint32_t firstQuery_local;
  VkQueryPool queryPool_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = dstOffset;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,queryCount));
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"CopyQueryPoolResults",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x295);
    std::__cxx11::string::~string((string *)local_50);
  }
  EndRenderScope(this);
  FlushBarriers(this);
  (*vkCmdCopyQueryPoolResults)
            (this->m_VkCmdBuffer,queryPool,firstQuery,queryCount,dstBuffer,msg.field_2._8_8_,stride,
             flags);
  return;
}

Assistant:

__forceinline void CopyQueryPoolResults(VkQueryPool        queryPool,
                                            uint32_t           firstQuery,
                                            uint32_t           queryCount,
                                            VkBuffer           dstBuffer,
                                            VkDeviceSize       dstOffset,
                                            VkDeviceSize       stride,
                                            VkQueryResultFlags flags)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Copy query results must be performed outside of render pass.
        EndRenderScope();
        FlushBarriers();
        vkCmdCopyQueryPoolResults(m_VkCmdBuffer, queryPool, firstQuery, queryCount,
                                  dstBuffer, dstOffset, stride, flags);
    }